

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O0

bool __thiscall SpiAnalyzer::IsInitialClockPolarityCorrect(SpiAnalyzer *this)

{
  BitState BVar1;
  element_type *peVar2;
  element_type *peVar3;
  U64 UVar4;
  FrameV2 local_58 [8];
  FrameV2 framev2;
  U64 local_40;
  Frame error_frame;
  SpiAnalyzer *this_local;
  
  BVar1 = AnalyzerChannelData::GetBitState();
  peVar2 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
  if (BVar1 == peVar2->mClockInactiveState) {
    this_local._7_1_ = true;
  }
  else {
    peVar3 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
    UVar4 = this->mCurrentSample;
    std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar3,(MarkerType)UVar4,(Channel *)0x3);
    if (this->mEnable == (AnalyzerChannelData *)0x0) {
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar4 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar4;
      this_local._7_1_ = true;
    }
    else {
      Frame::Frame((Frame *)&local_40);
      local_40 = this->mCurrentSample;
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar4 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar4;
      _error_frame = this->mCurrentSample;
      peVar3 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)peVar3);
      FrameV2::FrameV2(local_58);
      peVar3 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrameV2((FrameV2 *)peVar3,(char *)local_58,0x110007,local_40);
      std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::CommitResults();
      Analyzer::ReportProgress((ulonglong)this);
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar4 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar4;
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
      this_local._7_1_ = false;
      FrameV2::~FrameV2(local_58);
      Frame::~Frame((Frame *)&local_40);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SpiAnalyzer::IsInitialClockPolarityCorrect()
{
    if( mClock->GetBitState() == mSettings->mClockInactiveState )
        return true;

    mResults->AddMarker( mCurrentSample, AnalyzerResults::ErrorSquare, mSettings->mClockChannel );

    if( mEnable != NULL )
    {
        Frame error_frame;
        error_frame.mStartingSampleInclusive = mCurrentSample;

        mEnable->AdvanceToNextEdge();
        mCurrentSample = mEnable->GetSampleNumber();

        error_frame.mEndingSampleInclusive = mCurrentSample;
        error_frame.mFlags = SPI_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;
        mResults->AddFrame( error_frame );

        FrameV2 framev2;
        mResults->AddFrameV2( framev2, "error", error_frame.mStartingSampleInclusive, error_frame.mEndingSampleInclusive + 1 );

        mResults->CommitResults();
        ReportProgress( error_frame.mEndingSampleInclusive );

        // move to the next active-going enable edge
        mEnable->AdvanceToNextEdge();
        mCurrentSample = mEnable->GetSampleNumber();
        mClock->AdvanceToAbsPosition( mCurrentSample );

        return false;
    }
    else
    {
        mClock->AdvanceToNextEdge(); // at least start with the clock in the idle state.
        mCurrentSample = mClock->GetSampleNumber();
        return true;
    }
}